

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.h
# Opt level: O3

bool __thiscall
ZXing::DataMatrix::EdgeTracer::updateDirectionFromOrigin(EdgeTracer *this,PointF origin)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  uint uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  PointT<double> PVar10;
  double dVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar18;
  undefined1 auVar17 [16];
  
  dVar4 = (this->super_BitMatrixCursorF).d.x;
  dVar5 = (this->super_BitMatrixCursorF).d.y;
  auVar14._0_8_ = (this->super_BitMatrixCursorF).p.x - origin.x;
  auVar14._8_8_ = (this->super_BitMatrixCursorF).p.y - origin.y;
  dVar8 = ABS(auVar14._8_8_);
  if (ABS(auVar14._8_8_) <= ABS(auVar14._0_8_)) {
    dVar8 = ABS(auVar14._0_8_);
  }
  auVar1._8_4_ = SUB84(dVar8,0);
  auVar1._0_8_ = dVar8;
  auVar1._12_4_ = (int)((ulong)dVar8 >> 0x20);
  PVar10 = (PointT<double>)divpd(auVar14,auVar1);
  (this->super_BitMatrixCursorF).d = PVar10;
  dVar12 = PVar10.y;
  dVar9 = PVar10.x;
  dVar8 = dVar9 * dVar4 + dVar5 * dVar12;
  if (0.0 <= dVar8) {
    dVar16 = ABS(dVar9);
    dVar18 = ABS(dVar12);
    if ((dVar16 != dVar18) || (NAN(dVar16) || NAN(dVar18))) {
      uVar7 = -(ulong)(ABS(dVar5) < ABS(dVar4));
      dVar9 = (double)((ulong)dVar9 & -(ulong)(dVar18 < dVar16));
      dVar12 = (double)(~-(ulong)(dVar18 < dVar16) & (ulong)dVar12);
      auVar15._8_8_ = uVar7;
      auVar15._0_8_ = uVar7;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar4;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = ~uVar7 & (ulong)dVar5;
      auVar14 = auVar3 << 0x40 | auVar11 & auVar15;
      if ((dVar9 == auVar14._0_8_) &&
         ((!NAN(dVar9) && !NAN(auVar14._0_8_) && (dVar12 == auVar14._8_8_)))) goto LAB_001538c6;
    }
    else {
      uVar6 = (uint)(ABS(dVar5) < ABS(dVar4));
      auVar13._0_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
      auVar13._4_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
      auVar13._8_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
      auVar13._12_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar4;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = dVar5;
      auVar14 = ~auVar13 & auVar2 << 0x40 | auVar17 & auVar13;
      dVar9 = dVar9 - auVar14._0_8_;
      dVar12 = dVar12 - auVar14._8_8_;
    }
    (this->super_BitMatrixCursorF).d.x = dVar9 * 0.9900000095367432 + auVar14._0_8_;
    (this->super_BitMatrixCursorF).d.y = dVar12 * 0.9900000095367432 + auVar14._8_8_;
  }
LAB_001538c6:
  return 0.0 <= dVar8;
}

Assistant:

auto operator-(const PointT<T>& a, const PointT<U>& b) -> PointT<decltype(a.x - b.x)>
{
	return {a.x - b.x, a.y - b.y};
}